

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O0

void test_common<double>(uint length,double value)

{
  element_type eVar1;
  double dVar2;
  element_type eVar3;
  element_type eVar4;
  element_type eVar5;
  int iVar6;
  double *pdVar7;
  element_type *peVar8;
  element_type *pDst;
  undefined8 *puVar9;
  uint local_85c;
  uint local_858;
  uint i_4;
  uint i_3;
  uint i_2;
  uint i_1;
  uint i;
  double *b;
  double *a;
  undefined1 local_828 [8];
  shared_ptr<double> pb;
  shared_ptr<double> pa;
  double value_local;
  uint length_local;
  __m128d a_1;
  uint local_79c;
  element_type *local_798;
  __m128d a0_2;
  __m128d a0_1;
  __m128d a1;
  __m128d a0;
  uint local_55c;
  element_type *local_558;
  element_type *local_550;
  __m128d a0_5;
  __m128d a0_4;
  __m128d a1_1;
  __m128d a0_3;
  uint local_43c;
  element_type *local_438;
  element_type *local_430;
  uint local_108;
  uint uStack_104;
  uint uStack_100;
  uint uStack_fc;
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint local_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint local_a8;
  uint uStack_a4;
  uint local_98;
  uint uStack_94;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  uint local_28;
  uint uStack_24;
  uint local_18;
  uint uStack_14;
  
  pdVar7 = sse::common::malloc<double>(length + 1);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)
             &pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pdVar7,
             sse::common::free<double>);
  pdVar7 = sse::common::malloc<double>(length + 1);
  std::shared_ptr<double>::shared_ptr<double,void(*)(double*),void>
            ((shared_ptr<double> *)local_828,pdVar7,sse::common::free<double>);
  peVar8 = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)
                      &pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pDst = std::__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<double,_(__gnu_cxx::_Lock_policy)2> *)local_828);
  peVar8[length] = 127.0;
  pDst[length] = 63.0;
  local_798 = peVar8;
  for (local_79c = length; 7 < (int)local_79c; local_79c = local_79c - 8) {
    *local_798 = value;
    local_798[1] = value;
    local_798[2] = value;
    local_798[3] = value;
    local_798[4] = value;
    local_798[5] = value;
    local_798[6] = value;
    local_798[7] = value;
    local_798 = local_798 + 8;
  }
  if (3 < (int)local_79c) {
    *local_798 = value;
    local_798[1] = value;
    local_798[2] = value;
    local_798[3] = value;
    local_79c = local_79c - 4;
    local_798 = local_798 + 4;
  }
  if (1 < (int)local_79c) {
    *local_798 = value;
    local_798[1] = value;
    local_79c = local_79c - 2;
    local_798 = local_798 + 2;
  }
  if (local_79c != 0) {
    *local_798 = value;
  }
  for (i_2 = 0; local_55c = length, local_558 = pDst, local_550 = peVar8, i_2 < length;
      i_2 = i_2 + 1) {
    if ((peVar8[i_2] != value) || (NAN(peVar8[i_2]) || NAN(value))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x16;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)local_55c; local_55c = local_55c - 4) {
    eVar1 = *local_550;
    eVar3 = local_550[1];
    eVar4 = local_550[2];
    eVar5 = local_550[3];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_f8 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_f4 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_f0 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_ec = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_108 = SUB84(eVar1,0);
    uStack_104 = (uint)((ulong)eVar1 >> 0x20);
    uStack_100 = SUB84(eVar3,0);
    uStack_fc = (uint)((ulong)eVar3 >> 0x20);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_d8 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_d4 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_d0 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_cc = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_e8 = SUB84(eVar4,0);
    uStack_e4 = (uint)((ulong)eVar4 >> 0x20);
    uStack_e0 = SUB84(eVar5,0);
    uStack_dc = (uint)((ulong)eVar5 >> 0x20);
    *local_558 = (element_type)
                 CONCAT44((uStack_f4 ^ 0xffffffff) & uStack_104,(local_f8 ^ 0xffffffff) & local_108)
    ;
    local_558[1] = (element_type)
                   CONCAT44((uStack_ec ^ 0xffffffff) & uStack_fc,
                            (uStack_f0 ^ 0xffffffff) & uStack_100);
    local_558[2] = (element_type)
                   CONCAT44((uStack_d4 ^ 0xffffffff) & uStack_e4,(local_d8 ^ 0xffffffff) & local_e8)
    ;
    local_558[3] = (element_type)
                   CONCAT44((uStack_cc ^ 0xffffffff) & uStack_dc,
                            (uStack_d0 ^ 0xffffffff) & uStack_e0);
    local_558 = local_558 + 4;
    local_550 = local_550 + 4;
  }
  if (1 < (int)local_55c) {
    eVar1 = *local_550;
    eVar3 = local_550[1];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_b8 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_b4 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_b0 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_ac = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_c8 = SUB84(eVar1,0);
    uStack_c4 = (uint)((ulong)eVar1 >> 0x20);
    uStack_c0 = SUB84(eVar3,0);
    uStack_bc = (uint)((ulong)eVar3 >> 0x20);
    *local_558 = (element_type)
                 CONCAT44((uStack_b4 ^ 0xffffffff) & uStack_c4,(local_b8 ^ 0xffffffff) & local_c8);
    local_558[1] = (element_type)
                   CONCAT44((uStack_ac ^ 0xffffffff) & uStack_bc,
                            (uStack_b0 ^ 0xffffffff) & uStack_c0);
    local_55c = local_55c - 2;
    local_550 = local_550 + 2;
    local_558 = local_558 + 2;
  }
  if (local_55c != 0) {
    eVar1 = *local_550;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_98 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_94 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    local_a8 = SUB84(eVar1,0);
    uStack_a4 = (uint)((ulong)eVar1 >> 0x20);
    *local_558 = (element_type)
                 CONCAT44((uStack_94 ^ 0xffffffff) & uStack_a4,(local_98 ^ 0xffffffff) & local_a8);
  }
  for (i_3 = 0; i_3 < length; i_3 = i_3 + 1) {
    if ((pDst[i_3] != value) || (NAN(pDst[i_3]) || NAN(value))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x1d;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  sse::common::zero<double>(pDst,length);
  for (i_4 = 0; i_4 < length; i_4 = i_4 + 1) {
    if ((pDst[i_4] != 0.0) || (NAN(pDst[i_4]))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x24;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (local_858 = 0; local_43c = length, local_438 = pDst, local_430 = peVar8, local_858 < length;
      local_858 = local_858 + 1) {
    peVar8[local_858] = (double)local_858;
  }
  for (; 3 < (int)local_43c; local_43c = local_43c - 4) {
    eVar1 = *local_430;
    eVar3 = local_430[1];
    eVar4 = local_430[2];
    eVar5 = local_430[3];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_78 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_74 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_70 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_6c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_88 = SUB84(eVar1,0);
    uStack_84 = (uint)((ulong)eVar1 >> 0x20);
    uStack_80 = SUB84(eVar3,0);
    uStack_7c = (uint)((ulong)eVar3 >> 0x20);
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_58 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_54 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_50 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_4c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_68 = SUB84(eVar4,0);
    uStack_64 = (uint)((ulong)eVar4 >> 0x20);
    uStack_60 = SUB84(eVar5,0);
    uStack_5c = (uint)((ulong)eVar5 >> 0x20);
    *local_438 = (element_type)
                 CONCAT44((uStack_74 ^ 0xffffffff) & uStack_84,(local_78 ^ 0xffffffff) & local_88);
    local_438[1] = (element_type)
                   CONCAT44((uStack_6c ^ 0xffffffff) & uStack_7c,
                            (uStack_70 ^ 0xffffffff) & uStack_80);
    local_438[2] = (element_type)
                   CONCAT44((uStack_54 ^ 0xffffffff) & uStack_64,(local_58 ^ 0xffffffff) & local_68)
    ;
    local_438[3] = (element_type)
                   CONCAT44((uStack_4c ^ 0xffffffff) & uStack_5c,
                            (uStack_50 ^ 0xffffffff) & uStack_60);
    local_438 = local_438 + 4;
    local_430 = local_430 + 4;
  }
  if (1 < (int)local_43c) {
    eVar1 = *local_430;
    eVar3 = local_430[1];
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_38 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_34 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    uStack_30 = (uint)sse::internals::abs_pd(double(int))::sign_mask._8_8_;
    uStack_2c = SUB84(sse::internals::abs_pd(double(int))::sign_mask._8_8_,4);
    local_48 = SUB84(eVar1,0);
    uStack_44 = (uint)((ulong)eVar1 >> 0x20);
    uStack_40 = SUB84(eVar3,0);
    uStack_3c = (uint)((ulong)eVar3 >> 0x20);
    *local_438 = (element_type)
                 CONCAT44((uStack_34 ^ 0xffffffff) & uStack_44,(local_38 ^ 0xffffffff) & local_48);
    local_438[1] = (element_type)
                   CONCAT44((uStack_2c ^ 0xffffffff) & uStack_3c,
                            (uStack_30 ^ 0xffffffff) & uStack_40);
    local_43c = local_43c - 2;
    local_430 = local_430 + 2;
    local_438 = local_438 + 2;
  }
  if (local_43c != 0) {
    eVar1 = *local_430;
    if ((sse::internals::abs_pd(double(int))::sign_mask == '\0') &&
       (iVar6 = __cxa_guard_acquire(&sse::internals::abs_pd(double(int))::sign_mask), iVar6 != 0)) {
      sse::internals::abs_pd(double(int))::sign_mask._0_8_ = 0x8000000000000000;
      sse::internals::abs_pd(double(int))::sign_mask._8_8_ = 0x8000000000000000;
      __cxa_guard_release(&sse::internals::abs_pd(double(int))::sign_mask);
    }
    local_18 = (uint)sse::internals::abs_pd(double(int))::sign_mask._0_8_;
    uStack_14 = SUB84(sse::internals::abs_pd(double(int))::sign_mask._0_8_,4);
    local_28 = SUB84(eVar1,0);
    uStack_24 = (uint)((ulong)eVar1 >> 0x20);
    *local_438 = (element_type)
                 CONCAT44((uStack_14 ^ 0xffffffff) & uStack_24,(local_18 ^ 0xffffffff) & local_28);
  }
  for (local_85c = 0; local_85c < length; local_85c = local_85c + 1) {
    dVar2 = (double)local_85c;
    if ((pDst[local_85c] != dVar2) || (NAN(pDst[local_85c]) || NAN(dVar2))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_common(unsigned int, T) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x2d;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  if ((((peVar8[length] == 127.0) && (!NAN(peVar8[length]))) && (pDst[length] == 63.0)) &&
     (!NAN(pDst[length]))) {
    std::shared_ptr<double>::~shared_ptr((shared_ptr<double> *)local_828);
    std::shared_ptr<double>::~shared_ptr
              ((shared_ptr<double> *)
               &pb.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar9 = "void test_common(unsigned int, T) [T = double]";
  *(undefined4 *)(puVar9 + 1) = 0x31;
  *(uint *)((long)puVar9 + 0xc) = length;
  __cxa_throw(puVar9,&Exception::typeinfo,0);
}

Assistant:

void test_common(unsigned length, T value = 42)
{
    std::shared_ptr<T> pa = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    std::shared_ptr<T> pb = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * a = pa.get();
    T * b = pb.get();
    a[length] = 0x7f;
    b[length] = 0x3f;

    simd::set(value, a, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (a[i] != value)
            FAIL();
    }

    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != value)
            FAIL();
    }

    simd::zero(b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != 0)
            FAIL();
    }

    for (unsigned i=0; i<length; ++i)
        a[i] = i;
    simd::copy(a, b, length);
    for (unsigned i=0; i<length; ++i)
    {
        if (b[i] != (T)i)
            FAIL();
    }

    if (a[length] != 0x7f || b[length] != 0x3f)
        FAIL();
}